

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall CGL::SceneObjects::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined8 *puVar1;
  long lVar2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Mesh *pMVar7;
  mapped_type *pmVar8;
  Vector3D *pVVar9;
  Vector3D *pVVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  Vertex *v;
  vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> verts;
  unordered_map<const_CGL::Vertex_*,_int,_std::hash<const_CGL::Vertex_*>,_std::equal_to<const_CGL::Vertex_*>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>_>
  vertexLabels;
  value_type local_b0;
  HalfedgeMesh *local_a8;
  key_type local_a0;
  Mesh *local_98;
  BSDF *local_90;
  _Vector_base<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> local_88;
  _Hashtable<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_0029f030;
  this_00 = &this->indices;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar16 = 0;
  uVar13 = 0;
  p_Var14 = (_List_node_base *)&mesh->vertices;
  local_a8 = mesh;
  local_98 = this;
  local_90 = bsdf;
  while (p_Var14 = (((_List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)&p_Var14->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var14 != (_List_node_base *)&mesh->vertices) {
    local_b0 = (value_type)(p_Var14 + 1);
    std::vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::push_back
              ((vector<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_> *)&local_88,
               &local_b0);
    pmVar8 = std::__detail::
             _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_b0);
    *pmVar8 = (mapped_type)uVar13;
    uVar13 = uVar13 + 1;
    uVar16 = uVar16 + 0x20;
  }
  uVar15 = -(ulong)(uVar13 >> 0x3b != 0) | uVar16;
  pVVar9 = (Vector3D *)operator_new__(uVar15);
  pMVar7 = local_98;
  if (uVar13 != 0) {
    uVar12 = 0;
    do {
      *(undefined8 *)((long)&pVVar9->field_0 + uVar12 + 0x10) = 0;
      puVar1 = (undefined8 *)((long)&pVVar9->field_0 + uVar12);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar12 = uVar12 + 0x20;
    } while (uVar16 != uVar12);
  }
  local_98->positions = pVVar9;
  pVVar10 = (Vector3D *)operator_new__(uVar15);
  pVVar9 = pVVar10;
  uVar15 = uVar13;
  while (uVar15 != 0) {
    (pVVar9->field_0).field_0.z = 0.0;
    (pVVar9->field_0).field_0.x = 0.0;
    (pVVar9->field_0).field_0.y = 0.0;
    pVVar9 = pVVar9 + 1;
    uVar16 = uVar16 - 0x20;
    uVar15 = uVar16;
  }
  pMVar7->normals = pVVar10;
  lVar11 = 0;
  while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
    lVar2 = *(long *)((long)local_88._M_impl.super__Vector_impl_data._M_start + lVar11);
    uVar4 = *(undefined8 *)(lVar2 + 0x18);
    uVar5 = *(undefined8 *)(lVar2 + 0x20);
    uVar6 = *(undefined8 *)(lVar2 + 0x28);
    puVar1 = (undefined8 *)((long)&pMVar7->positions->field_0 + lVar11 * 4);
    *puVar1 = *(undefined8 *)(lVar2 + 0x10);
    puVar1[1] = uVar4;
    puVar1[2] = uVar5;
    puVar1[3] = uVar6;
    lVar2 = *(long *)((long)local_88._M_impl.super__Vector_impl_data._M_start + lVar11);
    uVar4 = *(undefined8 *)(lVar2 + 0x88);
    uVar5 = *(undefined8 *)(lVar2 + 0x90);
    uVar6 = *(undefined8 *)(lVar2 + 0x98);
    puVar1 = (undefined8 *)((long)&pMVar7->normals->field_0 + lVar11 * 4);
    *puVar1 = *(undefined8 *)(lVar2 + 0x80);
    puVar1[1] = uVar4;
    puVar1[2] = uVar5;
    puVar1[3] = uVar6;
    lVar11 = lVar11 + 8;
  }
  p_Var14 = (_List_node_base *)&local_a8->faces;
  local_a8 = (HalfedgeMesh *)p_Var14;
  while (p_Var14 = (((_List_base<CGL::Face,_std::allocator<CGL::Face>_> *)&p_Var14->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        (HalfedgeMesh *)p_Var14 != local_a8) {
    p_Var3 = p_Var14[10]._M_next;
    local_a0 = (key_type)(*(_List_node_base **)((long)(p_Var3 + 2) + 8) + 1);
    pmVar8 = std::__detail::
             _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_a0);
    local_b0 = (value_type)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&local_b0);
    local_a0 = (key_type)(*(long *)((long)p_Var3[2]._M_next + 0x28) + 0x10);
    pmVar8 = std::__detail::
             _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_a0);
    local_b0 = (value_type)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&local_b0);
    local_a0 = (key_type)(*(long *)(*(long *)((long)p_Var3[2]._M_next + 0x20) + 0x28) + 0x10);
    pmVar8 = std::__detail::
             _Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_a0);
    local_b0 = (value_type)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&local_b0);
  }
  local_98->bsdf = local_90;
  std::_Vector_base<const_CGL::Vertex_*,_std::allocator<const_CGL::Vertex_*>_>::~_Vector_base
            (&local_88);
  std::
  _Hashtable<const_CGL::Vertex_*,_std::pair<const_CGL::Vertex_*const,_int>,_std::allocator<std::pair<const_CGL::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CGL::Vertex_*>,_std::hash<const_CGL::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {

  unordered_map<const Vertex *, int> vertexLabels;
  vector<const Vertex *> verts;

  size_t vertexI = 0;
  for (VertexCIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    const Vertex *v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals   = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i]   = verts[i]->normal;
  }

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;

}